

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

void slang::assert::handleUnreachable(source_location *location)

{
  logic_error *this;
  source_location *in_RDI;
  string msg;
  undefined1 in_stack_00000130 [16];
  undefined1 in_stack_00000140 [16];
  char *local_118;
  uint_least32_t local_10c;
  char *local_108;
  char *local_100;
  undefined8 local_f8;
  string local_f0 [32];
  source_location *local_d0;
  char *local_c8 [2];
  uint_least32_t local_b8 [4];
  undefined1 local_a8 [16];
  undefined8 local_98;
  char **local_90;
  char *local_88;
  undefined8 uStack_80;
  char **local_70;
  uint_least32_t *local_68;
  char **local_60;
  char *local_58;
  undefined8 uStack_50;
  string *local_48;
  undefined1 *local_38;
  char *local_30;
  char **local_28;
  uint_least32_t local_1c;
  uint_least32_t *local_18;
  char **local_10;
  undefined8 *local_8;
  
  local_100 = "Supposedly unreachable code was executed\n  in file {}, line {}\n  function: {}\n";
  local_f8 = 0x4e;
  local_d0 = in_RDI;
  local_108 = std::source_location::file_name(in_RDI);
  local_10c = std::source_location::line(local_d0);
  local_118 = std::source_location::function_name(local_d0);
  local_58 = local_100;
  uStack_50 = local_f8;
  local_60 = &local_108;
  local_68 = &local_10c;
  local_70 = &local_118;
  local_88 = local_100;
  uStack_80 = local_f8;
  local_30 = local_108;
  local_28 = local_c8;
  local_c8[0] = local_108;
  local_18 = local_b8;
  local_1c = local_10c;
  local_38 = local_a8;
  local_8 = &local_98;
  local_98 = 0xc2c;
  local_48 = local_f0;
  local_10 = local_28;
  local_b8[0] = local_1c;
  local_90 = local_28;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000140,(format_args)in_stack_00000130);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,local_f0);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

[[noreturn]] void handleUnreachable(const std::source_location& location) {
    auto msg = fmt::format("Supposedly unreachable code was executed\n  in file {}, line {}\n"
                           "  function: {}\n",
                           location.file_name(), location.line(), location.function_name());

#if __cpp_exceptions
    throw std::logic_error(msg);
#else
    fprintf(stderr, "%s", msg.c_str());
    std::abort();
#endif
}